

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufq.c
# Opt level: O2

void Curl_bufq_reset(bufq *q)

{
  buf_chunk *pbVar1;
  buf_chunk *pbVar2;
  
  pbVar2 = q->head;
  while (pbVar2 != (buf_chunk *)0x0) {
    pbVar1 = pbVar2->next;
    q->head = pbVar1;
    pbVar2->next = q->spare;
    q->spare = pbVar2;
    pbVar2 = pbVar1;
  }
  q->tail = (buf_chunk *)0x0;
  return;
}

Assistant:

void Curl_bufq_reset(struct bufq *q)
{
  struct buf_chunk *chunk;
  while(q->head) {
    chunk = q->head;
    q->head = chunk->next;
    chunk->next = q->spare;
    q->spare = chunk;
  }
  q->tail = NULL;
}